

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chai-serialization.hpp
# Opt level: O1

void henson::Serialization<chaiscript::Boxed_Value>::load(BinaryBuffer *bb,Boxed_Value *bv)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  data_t dVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  runtime_error *this;
  Data *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int i;
  string s;
  int tag;
  Boxed_Value local_68;
  data_t local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  ulong local_48 [4];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  undefined4 local_1c;
  
  (*bb->_vptr_BinaryBuffer[1])(bb,&local_1c,4);
  switch(local_1c) {
  case 0:
    (*bb->_vptr_BinaryBuffer[1])(bb,&local_68,4);
    chaiscript::Boxed_Value::Object_Data::get<int>
              ((Object_Data *)&local_58.head_,
               (int)local_68.m_data.
                    super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr._0_4_,false);
    break;
  case 1:
    (*bb->_vptr_BinaryBuffer[1])(bb,&local_68,4);
    chaiscript::Boxed_Value::Object_Data::get<float>
              ((Object_Data *)&local_58.head_,
               local_68.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
               _0_4_,false);
    break;
  case 2:
    (*bb->_vptr_BinaryBuffer[1])(bb,&local_68,8);
    chaiscript::Boxed_Value::Object_Data::get<double>
              ((Object_Data *)&local_58.head_,
               (double)local_68.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,false);
    break;
  case 3:
    (*bb->_vptr_BinaryBuffer[1])(bb,&local_68,8);
    chaiscript::Boxed_Value::Object_Data::get<unsigned_long>
              ((Object_Data *)&local_58.head_,
               (unsigned_long)
               local_68.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               false);
    break;
  case 4:
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48[0] = local_48[0] & 0xffffffffffffff00;
    local_58 = (data_t)local_48;
    Serialization<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::load(bb,(String *)&local_58.head_);
    chaiscript::Boxed_Value::Boxed_Value<std::__cxx11::string&,void>
              (&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58.head_,
               false);
    _Var2._M_pi = local_68.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_68.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if (local_68.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_58 == (data_t)local_48) {
      return;
    }
    operator_delete((void *)local_58,local_48[0] + 1);
    return;
  case 5:
    local_58 = (data_t)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((ulong)p_Stack_50 & 0xffffffff00000000);
    local_48[0] = 0;
    local_48[1] = 0;
    local_48[2] = 0;
    local_48[3] = 0;
    local_28 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Serialization<henson::Array>::load(bb,(Array *)&local_58.head_);
    chaiscript::Boxed_Value::Boxed_Value<henson::Array&,void>
              (&local_68,(Array *)&local_58.head_,false);
    _Var2._M_pi = local_68.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_68.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    p_Var5 = local_28;
    if (local_68.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      p_Var5 = local_28;
    }
    goto LAB_001e8e07;
  case 6:
    local_58 = (data_t)0x0;
    p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48[0] = 0;
    Serialization<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>::
    load(bb,(Vector *)&local_58.head_);
    chaiscript::Boxed_Value::
    Boxed_Value<std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>&,void>
              (&local_68,
               (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               &local_58.head_,false);
    _Var2._M_pi = local_68.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar1 = local_68.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var5 = (bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar1;
    (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var2._M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    if (local_68.m_data.
        super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.m_data.
                 super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
              ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
               &local_58.head_);
    return;
  case 7:
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    p_Var4->_M_use_count = 1;
    p_Var4->_M_weak_count = 1;
    p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_003110a8;
    p_Var4[1]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var4[1]._M_use_count = 0;
    p_Var4[1]._M_weak_count = 0;
    *(undefined4 *)&p_Var4[2]._vptr__Sp_counted_base = 0x20;
    p_Var4[2]._M_use_count = 0;
    p_Var4[2]._M_weak_count = 0;
    p_Var4[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var4[3]._M_use_count = 0;
    p_Var4[3]._M_weak_count = 0;
    p_Var4[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined2 *)&p_Var4[4]._M_use_count = 0;
    (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)(p_Var4 + 1);
    p_Var5 = (bv->m_data).
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var4;
    goto LAB_001e8e07;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Cannot deserialize a boxed value");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  p_Var5 = p_Stack_50;
  dVar3 = local_58;
  local_58 = (data_t)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)dVar3;
  (bv->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  p_Var5 = p_Stack_50;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    p_Var5 = p_Stack_50;
  }
LAB_001e8e07:
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, chaiscript::Boxed_Value& bv)
        {
            int tag;
            henson::load(bb, tag);
            if (tag == tags::int_)
            {
                int i;
                henson::load(bb, i);
                bv = chaiscript::Boxed_Value(i);
            } else if (tag == tags::float_)
            {
                float f;
                henson::load(bb, f);
                bv = chaiscript::Boxed_Value(f);
            } else if (tag == tags::double_)
            {
                double d;
                henson::load(bb, d);
                bv = chaiscript::Boxed_Value(d);
            } else if (tag == tags::size_t_)
            {
                size_t s;
                henson::load(bb, s);
                bv = chaiscript::Boxed_Value(s);
            } else if (tag == tags::string_)
            {
                std::string s;
                henson::load(bb, s);
                bv = chaiscript::Boxed_Value(s);
            } else if (tag == tags::vector_)
            {
                std::vector<chaiscript::Boxed_Value> v;
                henson::load(bb, v);
                bv = chaiscript::Boxed_Value(v);
            } else if (tag == tags::array_)
            {
                Array a;
                henson::load(bb, a);
                bv = chaiscript::Boxed_Value(a);
            } else if (tag == tags::undef_)
                bv = chaiscript::Boxed_Value();
            else
                throw std::runtime_error("Cannot deserialize a boxed value");
        }